

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

VkFormat ktxTexture1_GetVkFormat(ktxTexture1 *This)

{
  long in_RDI;
  VkFormat vkFormat;
  GLenum in_stack_0000001c;
  GLenum in_stack_00000020;
  undefined4 local_c;
  
  local_c = vkGetFormatFromOpenGLInternalFormat(*(GLenum *)(in_RDI + 0x7c));
  if (local_c == VK_FORMAT_UNDEFINED) {
    local_c = vkGetFormatFromOpenGLFormat(in_stack_00000020,in_stack_0000001c);
  }
  return local_c;
}

Assistant:

VkFormat
ktxTexture1_GetVkFormat(ktxTexture1* This)
{
    VkFormat vkFormat;

    vkFormat = vkGetFormatFromOpenGLInternalFormat(This->glInternalformat);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        vkFormat = vkGetFormatFromOpenGLFormat(This->glFormat,
            This->glType);
    }
    return vkFormat;
}